

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall
defyx::JitCompilerX86::generateSuperscalarHash<2ul>
          (JitCompilerX86 *this,SuperscalarProgram (*programs) [2],
          vector<unsigned_long,_std::allocator<unsigned_long>_> *reciprocalCache)

{
  uint32_t uVar1;
  int iVar2;
  SuperscalarProgram *this_00;
  long in_RSI;
  JitCompilerX86 *in_RDI;
  Instruction *instr;
  uint i;
  SuperscalarProgram *prog;
  uint j;
  undefined4 in_stack_ffffffffffffffb8;
  Instruction *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  uint pc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  memcpy(in_RDI->code + 0x2000,codeShhInit,(long)codeSshInitSize);
  in_RDI->codePos = codeSshInitSize + 0x2000;
  for (uVar4 = 0; uVar4 < 2; uVar4 = uVar4 + 1) {
    this_00 = (SuperscalarProgram *)(in_RSI + (ulong)uVar4 * 0x1068);
    uVar3 = 0;
    while( true ) {
      pc = uVar3;
      uVar1 = SuperscalarProgram::getSize(this_00);
      if (uVar1 <= uVar3) break;
      in_stack_ffffffffffffffc8 = SuperscalarProgram::operator()(this_00,pc);
      generateSuperscalarCode
                ((JitCompilerX86 *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),this_00->programBuffer,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(pc,in_stack_ffffffffffffffd0));
      uVar3 = pc + 1;
    }
    emit((JitCompilerX86 *)CONCAT44(pc,in_stack_ffffffffffffffd0),&in_stack_ffffffffffffffc8->opcode
         ,(size_t)in_RDI);
    if (uVar4 == 0) {
      emit<2ul>(in_RDI,(uint8_t (*) [2])CONCAT44(uVar3,in_stack_ffffffffffffffb8));
      iVar2 = SuperscalarProgram::getAddressRegister(this_00);
      emitByte(in_RDI,(char)iVar2 + 0xd8);
      emit((JitCompilerX86 *)CONCAT44(pc,in_stack_ffffffffffffffd0),
           &in_stack_ffffffffffffffc8->opcode,(size_t)in_RDI);
    }
  }
  emitByte(in_RDI,0xc3);
  return;
}

Assistant:

void JitCompilerX86::generateSuperscalarHash(SuperscalarProgram(&programs)[N], std::vector<uint64_t> &reciprocalCache) {
		memcpy(code + superScalarHashOffset, codeShhInit, codeSshInitSize);
		codePos = superScalarHashOffset + codeSshInitSize;
		for (unsigned j = 0; j < N; ++j) {
			SuperscalarProgram& prog = programs[j];
			for (unsigned i = 0; i < prog.getSize(); ++i) {
				Instruction& instr = prog(i);
				generateSuperscalarCode(instr, reciprocalCache);
			}
			emit(codeShhLoad, codeSshLoadSize);
			if (j < N - 1) {
				emit(REX_MOV_RR64);
				emitByte(0xd8 + prog.getAddressRegister());
				emit(codeShhPrefetch, codeSshPrefetchSize);
#ifdef RANDOMX_ALIGN
				int align = (codePos % 16);
				while (align != 0) {
					int nopSize = 16 - align;
					if (nopSize > 8) nopSize = 8;
					emit(NOPX[nopSize - 1], nopSize);
					align = (codePos % 16);
				}
#endif
			}
		}
		emitByte(RET);
	}